

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::SonarQubeReporter::writeTestCase(SonarQubeReporter *this,TestCaseNode *testCaseNode)

{
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *this_00;
  SectionNode *sectionNode;
  allocator<char> local_41;
  string local_40;
  
  this_00 = (testCaseNode->children).
            super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(testCaseNode->children).
            super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 8) {
    sectionNode = Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    writeSection(this,&local_40,sectionNode,
                 (((testCaseNode->value).testInfo)->properties & (MayFail|ShouldFail)) != None);
    std::__cxx11::string::~string((string *)&local_40);
    return;
  }
  __assert_fail("testCaseNode.children.size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0x26fa,"void Catch::SonarQubeReporter::writeTestCase(const TestCaseNode &)");
}

Assistant:

void SonarQubeReporter::writeTestCase(TestCaseNode const& testCaseNode) {
        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert(testCaseNode.children.size() == 1);
        SectionNode const& rootSection = *testCaseNode.children.front();
        writeSection("", rootSection, testCaseNode.value.testInfo->okToFail());
    }